

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

float64 vector_maha_precomp(float32 *var,int32 len)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar1 = 0;
  if (0 < len) {
    uVar1 = (ulong)(uint)len;
  }
  dVar4 = 0.0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar3 = log((double)(float)var[uVar2]);
    dVar4 = dVar4 - dVar3;
    var[uVar2] = (float32)(1.0 / ((float)var[uVar2] + (float)var[uVar2]));
  }
  return (float64)(((double)len * -1.8378770664093453 + dVar4) * 0.5);
}

Assistant:

float64
vector_maha_precomp(float32 * var, int32 len)
{
    float64 det;
    int32 i;

    for (det = (float64) 0.0, i = 0; i < len; i++) {    /* log(1.0/prod(var[i])) */
        det -= (float64) (log(var[i]));
        var[i] = (float32) (1.0 / (var[i] * 2.0));
    }
    det -= log(2.0 * M_PI) * len;

    return (det * 0.5);         /* sqrt */
}